

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O3

Polynom<Complex> __thiscall Polynom<Complex>::ordinalAdd(Polynom<Complex> *this,Polynom<Complex> *a)

{
  Complex *pCVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  matrix_error *this_00;
  Matrix<Complex> *in_RDX;
  Complex *extraout_RDX;
  Complex *extraout_RDX_00;
  Complex *extraout_RDX_01;
  Complex *extraout_RDX_02;
  Complex *extraout_RDX_03;
  Complex *extraout_RDX_04;
  Complex *extraout_RDX_05;
  Complex *pCVar7;
  ulong uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  Matrix<Complex> *a_00;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  Polynom<Complex> PVar13;
  Complex local_b0;
  
  bVar3 = isOrdinal(a);
  if ((!bVar3) || (bVar3 = isOrdinal((Polynom<Complex> *)in_RDX), !bVar3)) {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Invalid ordinal");
    __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = degree((Polynom<Complex> *)in_RDX);
  a_00 = &a->m;
  if (-1 < iVar4) {
    iVar4 = degree(a);
    iVar5 = degree((Polynom<Complex> *)in_RDX);
    uVar11 = iVar4 - iVar5;
    a_00 = in_RDX;
    if (-1 < (int)uVar11) {
      iVar6 = degree(a);
      Polynom(this,iVar6 + 1);
      uVar12 = (ulong)uVar11;
      if (iVar4 != iVar5) {
        lVar10 = 0;
        uVar8 = uVar12;
        do {
          pCVar7 = (a->m).arr;
          pCVar1 = (this->m).arr;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)&(pCVar1->_re)._numerator.digits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar10),
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)&(pCVar7->_re)._numerator.digits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar10));
          (&(pCVar1->_re)._numerator.negative)[lVar10] =
               (&(pCVar7->_re)._numerator.negative)[lVar10];
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)&(pCVar1->_re)._denominator.digits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar10),
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)&(pCVar7->_re)._denominator.digits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar10));
          (&(pCVar1->_re)._denominator.negative)[lVar10] =
               (&(pCVar7->_re)._denominator.negative)[lVar10];
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)&(pCVar1->_im)._numerator.digits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar10),
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)&(pCVar7->_im)._numerator.digits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar10));
          (&(pCVar1->_im)._numerator.negative)[lVar10] =
               (&(pCVar7->_im)._numerator.negative)[lVar10];
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)&(pCVar1->_im)._denominator.digits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar10),
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)&(pCVar7->_im)._denominator.digits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar10));
          (&(pCVar1->_im)._denominator.negative)[lVar10] =
               (&(pCVar7->_im)._denominator.negative)[lVar10];
          lVar10 = lVar10 + 0x80;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      ::operator+(&local_b0,(a->m).arr + uVar12,in_RDX->arr);
      pCVar7 = (this->m).arr + uVar12;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pCVar7,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0);
      (pCVar7->_re)._numerator.negative = local_b0._re._numerator.negative;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&(pCVar7->_re)._denominator.digits,&local_b0._re._denominator.digits);
      (pCVar7->_re)._denominator.negative = local_b0._re._denominator.negative;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pCVar7->_im,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0._im);
      (pCVar7->_im)._numerator.negative = local_b0._im._numerator.negative;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&(pCVar7->_im)._denominator.digits,&local_b0._im._denominator.digits);
      (pCVar7->_im)._denominator.negative = local_b0._im._denominator.negative;
      pCVar7 = extraout_RDX;
      if (local_b0._im._denominator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0._im._denominator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
        pCVar7 = extraout_RDX_00;
      }
      if (local_b0._im._numerator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0._im._numerator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
        pCVar7 = extraout_RDX_01;
      }
      if (local_b0._re._denominator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0._re._denominator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
        pCVar7 = extraout_RDX_02;
      }
      if (local_b0._re._numerator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0._re._numerator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
        pCVar7 = extraout_RDX_03;
      }
      if (uVar11 + 1 < (this->m).N) {
        uVar8 = (ulong)(uVar11 + 1);
        lVar10 = 0x80;
        uVar12 = uVar8;
        do {
          pCVar7 = in_RDX->arr;
          pCVar1 = (this->m).arr;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)&pCVar1[uVar8 - 1]._re._numerator.digits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar10),
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)&(pCVar7->_re)._numerator.digits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar10));
          pvVar9 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)&(pCVar7->_re)._denominator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar10);
          lVar2 = lVar10 + uVar8 * 0x80;
          *(undefined1 *)((long)pCVar1 + lVar2 + -0x68) =
               *(undefined1 *)
                &pvVar9[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)pCVar1 + lVar2 + -0x60),pvVar9);
          pvVar9 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)&(pCVar7->_im)._numerator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar10);
          lVar2 = lVar10 + uVar8 * 0x80;
          *(undefined1 *)((long)pCVar1 + lVar2 + -0x48) =
               *(undefined1 *)
                &pvVar9[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)pCVar1 + lVar2 + -0x40),pvVar9);
          pvVar9 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)&(pCVar7->_im)._denominator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar10);
          lVar2 = lVar10 + uVar8 * 0x80;
          *(undefined1 *)((long)pCVar1 + lVar2 + -0x28) =
               *(undefined1 *)
                &pvVar9[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)pCVar1 + lVar2 + -0x20),pvVar9);
          *(bool *)((long)pCVar1 + lVar10 + -8 + uVar8 * 0x80) =
               (&(pCVar7->_im)._denominator.negative)[lVar10];
          uVar12 = uVar12 + 1;
          lVar10 = lVar10 + 0x80;
          pCVar7 = extraout_RDX_04;
        } while (uVar12 < (this->m).N);
      }
      goto LAB_0014472c;
    }
  }
  Matrix<Complex>::Matrix(&this->m,a_00);
  pCVar7 = extraout_RDX_05;
LAB_0014472c:
  PVar13.m.arr = pCVar7;
  PVar13.m._0_8_ = this;
  return (Polynom<Complex>)PVar13.m;
}

Assistant:

const Polynom<Field> Polynom<Field>::ordinalAdd(const Polynom &a) const
{
    if(!isOrdinal() || !a.isOrdinal())
        throw matrix_error("Invalid ordinal");
    if(a.degree() < 0)
        return *this;
    int degdiff = degree() - a.degree();
    if(degdiff < 0)
        return a;
    Polynom x(degree() + 1);
    for(int i = 0; i < degdiff; ++i)
    {
        x.m[0][i] = m[0][i];
    }
    x.m[0][degdiff] = m[0][degdiff] + a.m[0][0];
    for(unsigned i = degdiff + 1; i < x.m.width(); ++i)
    {
        x.m[0][i] = a.m[0][i - degdiff];
    }
    return x;
}